

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_scalar_by_extension
          (REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char **scalar_names,char *filename)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  size_t end_of_string;
  char *filename_local;
  char **scalar_names_local;
  REF_DBL *scalar_local;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  
  sVar3 = strlen(filename);
  if ((9 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 9),"-edge.tec"), iVar1 == 0)) {
    uVar2 = ref_gather_scalar_edge_tec(ref_grid,ldim,scalar,scalar_names,filename);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x1117,"ref_gather_scalar_by_extension",(ulong)uVar2,"scalar edge tec");
      return uVar2;
    }
    return 0;
  }
  if ((10 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 10),"-brick.plt"), iVar1 == 0)) {
    uVar2 = ref_gather_scalar_plt(ref_grid,ldim,scalar,scalar_names,1,filename);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x111e,"ref_gather_scalar_by_extension",(ulong)uVar2,"scalar tec");
      return uVar2;
    }
    return 0;
  }
  if ((4 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 4),".plt"), iVar1 == 0)) {
    uVar2 = ref_gather_scalar_plt(ref_grid,ldim,scalar,scalar_names,0,filename);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x1124,"ref_gather_scalar_by_extension",(ulong)uVar2,"scalar tec");
      return uVar2;
    }
    return 0;
  }
  if ((((sVar3 < 5) || (iVar1 = strcmp(filename + (sVar3 - 4),".tec"), iVar1 != 0)) &&
      ((sVar3 < 5 || (iVar1 = strcmp(filename + (sVar3 - 4),".dat"), iVar1 != 0)))) &&
     ((sVar3 < 3 || (iVar1 = strcmp(filename + (sVar3 - 2),".t"), iVar1 != 0)))) {
    if ((4 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 4),".pcd"), iVar1 == 0)) {
      uVar2 = ref_gather_scalar_pcd(ref_grid,ldim,scalar,scalar_names,filename);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x1132,"ref_gather_scalar_by_extension",(ulong)uVar2,"scalar pcd");
        return uVar2;
      }
      return 0;
    }
    if ((4 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 4),".rst"), iVar1 == 0)) {
      uVar2 = ref_gather_scalar_rst(ref_grid,ldim,scalar,filename);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x1136,"ref_gather_scalar_by_extension",(ulong)uVar2,"scalar rst");
        return uVar2;
      }
      return 0;
    }
    if ((0xc < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 0xc),".restart_sol"), iVar1 == 0)) {
      uVar2 = ref_gather_scalar_cell_restart_sol(ref_grid,ldim,scalar,filename);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x113c,"ref_gather_scalar_by_extension",(ulong)uVar2,"scalar sol");
        return uVar2;
      }
      return 0;
    }
    if ((4 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 4),".sol"), iVar1 == 0)) {
      uVar2 = ref_gather_scalar_sol(ref_grid,ldim,scalar,filename);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x1140,"ref_gather_scalar_by_extension",(ulong)uVar2,"scalar sol");
        return uVar2;
      }
      return 0;
    }
    if ((0xf < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 0xf),"-usm3dcell.solb"), iVar1 == 0)) {
      uVar2 = ref_gather_scalar_cell_solb(ref_grid,ldim,scalar,filename);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x1146,"ref_gather_scalar_by_extension",(ulong)uVar2,"scalar usm3d cell solb");
        return uVar2;
      }
      return 0;
    }
    if ((5 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 5),".solb"), iVar1 == 0)) {
      uVar2 = ref_gather_scalar_solb(ref_grid,ldim,scalar,filename);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x114b,"ref_gather_scalar_by_extension",(ulong)uVar2,"scalar solb");
        return uVar2;
      }
      return 0;
    }
    if ((4 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 4),".bin"), iVar1 == 0)) {
      uVar2 = ref_gather_scalar_bin(ref_grid,ldim,scalar,filename);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x114f,"ref_gather_scalar_by_extension",(ulong)uVar2,"scalar bin");
        return uVar2;
      }
      return 0;
    }
    if ((4 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 4),".txt"), iVar1 == 0)) {
      uVar2 = ref_gather_scalar_txt(ref_grid,ldim,scalar," ",filename);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x1154,"ref_gather_scalar_by_extension",(ulong)uVar2,"scalar txt");
        return uVar2;
      }
      return 0;
    }
    if ((4 < sVar3) && (iVar1 = strcmp(filename + (sVar3 - 4),".csv"), iVar1 == 0)) {
      uVar2 = ref_gather_scalar_txt(ref_grid,ldim,scalar,",",filename);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x1159,"ref_gather_scalar_by_extension",(ulong)uVar2,"scalar txt");
        return uVar2;
      }
      return 0;
    }
    printf("%s: %d: %s %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x115c
           ,"input file name extension unknown",filename);
    ref_grid_local._4_4_ = 1;
  }
  else {
    ref_grid_local._4_4_ = ref_gather_scalar_tec(ref_grid,ldim,scalar,scalar_names,filename);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x112d,"ref_gather_scalar_by_extension",(ulong)ref_grid_local._4_4_,"scalar tec");
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_gather_scalar_by_extension(REF_GRID ref_grid,
                                                  REF_INT ldim, REF_DBL *scalar,
                                                  const char **scalar_names,
                                                  const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (end_of_string > 9 &&
      strcmp(&filename[end_of_string - 9], "-edge.tec") == 0) {
    RSS(ref_gather_scalar_edge_tec(ref_grid, ldim, scalar, scalar_names,
                                   filename),
        "scalar edge tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], "-brick.plt") == 0) {
    RSS(ref_gather_scalar_plt(ref_grid, ldim, scalar, scalar_names, REF_TRUE,
                              filename),
        "scalar tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".plt") == 0) {
    RSS(ref_gather_scalar_plt(ref_grid, ldim, scalar, scalar_names, REF_FALSE,
                              filename),
        "scalar tec");
    return REF_SUCCESS;
  }
  if ((end_of_string > 4 &&
       strcmp(&filename[end_of_string - 4], ".tec") == 0) ||
      (end_of_string > 4 &&
       strcmp(&filename[end_of_string - 4], ".dat") == 0) ||
      (end_of_string > 2 && strcmp(&filename[end_of_string - 2], ".t") == 0)) {
    RSS(ref_gather_scalar_tec(ref_grid, ldim, scalar, scalar_names, filename),
        "scalar tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".pcd") == 0) {
    RSS(ref_gather_scalar_pcd(ref_grid, ldim, scalar, scalar_names, filename),
        "scalar pcd");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".rst") == 0) {
    RSS(ref_gather_scalar_rst(ref_grid, ldim, scalar, filename), "scalar rst");
    return REF_SUCCESS;
  }
  if (end_of_string > 12 &&
      strcmp(&filename[end_of_string - 12], ".restart_sol") == 0) {
    RSS(ref_gather_scalar_cell_restart_sol(ref_grid, ldim, scalar, filename),
        "scalar sol");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".sol") == 0) {
    RSS(ref_gather_scalar_sol(ref_grid, ldim, scalar, filename), "scalar sol");
    return REF_SUCCESS;
  }
  if (end_of_string > 15 &&
      strcmp(&filename[end_of_string - 15], "-usm3dcell.solb") == 0) {
    RSS(ref_gather_scalar_cell_solb(ref_grid, ldim, scalar, filename),
        "scalar usm3d cell solb");
    return REF_SUCCESS;
  }
  if (end_of_string > 5 && strcmp(&filename[end_of_string - 5], ".solb") == 0) {
    RSS(ref_gather_scalar_solb(ref_grid, ldim, scalar, filename),
        "scalar solb");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".bin") == 0) {
    RSS(ref_gather_scalar_bin(ref_grid, ldim, scalar, filename), "scalar bin");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".txt") == 0) {
    RSS(ref_gather_scalar_txt(ref_grid, ldim, scalar, " ", filename),
        "scalar txt");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".csv") == 0) {
    RSS(ref_gather_scalar_txt(ref_grid, ldim, scalar, ",", filename),
        "scalar txt");
    return REF_SUCCESS;
  }
  printf("%s: %d: %s %s\n", __FILE__, __LINE__,
         "input file name extension unknown", filename);
  return REF_FAILURE;
}